

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O2

void ImGui::ShadeVertsLinearColorGradientKeepAlpha
               (ImDrawList *draw_list,int vert_start_idx,int vert_end_idx,ImVec2 gradient_p0,
               ImVec2 gradient_p1,ImU32 col0,ImU32 col1)

{
  ImDrawVert *pIVar1;
  ImDrawVert *vert;
  ImDrawVert *pIVar2;
  uint uVar3;
  uint uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  fVar5 = gradient_p1.x - gradient_p0.x;
  fVar6 = gradient_p1.y - gradient_p0.y;
  pIVar1 = (draw_list->VtxBuffer).Data;
  uVar4 = col0 >> 8 & 0xff;
  uVar3 = col0 >> 0x10 & 0xff;
  for (pIVar2 = pIVar1 + vert_start_idx; pIVar2 < pIVar1 + vert_end_idx; pIVar2 = pIVar2 + 1) {
    fVar7 = (((pIVar2->pos).x - gradient_p0.x) * fVar5 + ((pIVar2->pos).y - gradient_p0.y) * fVar6)
            * (1.0 / (fVar5 * fVar5 + fVar6 * fVar6));
    fVar8 = 1.0;
    if (fVar7 <= 1.0) {
      fVar8 = fVar7;
    }
    fVar8 = (float)(~-(uint)(fVar7 < 0.0) & (uint)fVar8);
    pIVar2->col = (uint)*(byte *)((long)&pIVar2->col + 3) << 0x18 |
                  (int)((float)(int)((col1 & 0xff) - (col0 & 0xff)) * fVar8 + (float)(col0 & 0xff))
                  | (int)((float)(int)((col1 >> 8 & 0xff) - uVar4) * fVar8 + (float)uVar4) << 8 |
                  (int)(fVar8 * (float)(int)((col1 >> 0x10 & 0xff) - uVar3) + (float)uVar3) << 0x10;
  }
  return;
}

Assistant:

static inline ImVec2 operator-(const ImVec2& lhs, const ImVec2& rhs)            { return ImVec2(lhs.x-rhs.x, lhs.y-rhs.y); }